

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O1

bool __thiscall webfront::http::Request::completeRequest(Request *this,char input)

{
  bool bVar1;
  Method MVar2;
  uint uVar3;
  int iVar4;
  BadRequestException *this_00;
  char *in_RDX;
  char *extraout_RDX;
  string *this_01;
  string_view text;
  anon_class_1_0_00000001 local_69;
  Header local_68;
  
  if (completeRequest(char)::buffer_abi_cxx11_ == '\0') {
    completeRequest();
    in_RDX = extraout_RDX;
  }
  bVar1 = true;
  switch(this->state) {
  case methodStart:
    if (((input < '\0') || ((byte)input < 0x20)) || (input == '\x7f')) {
      this->state = method;
    }
    else {
      bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_69,input);
      this->state = method;
      if (!bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(&completeRequest(char)::buffer_abi_cxx11_,0,
                       completeRequest(char)::buffer_abi_cxx11_._M_string_length,1,input);
        return false;
      }
    }
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
    goto LAB_00112658;
  case method:
    if (input != ' ') {
      if (((-1 < input) && (0x1f < (byte)input)) && (input != '\x7f')) {
        uVar3 = (int)input - 9;
        if (((0x37 < uVar3) || ((0xfe004982800001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
           ((uVar3 = (int)input - 0x5b, 0x22 < uVar3 ||
            ((0x500000007U >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) {
          this_01 = &completeRequest(char)::buffer_abi_cxx11_;
          goto LAB_0011241f;
        }
      }
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    this->state = URI;
    text._M_str = in_RDX;
    text._M_len = (size_t)completeRequest(char)::buffer_abi_cxx11_._M_dataplus._M_p;
    MVar2 = getMethodFromString((Request *)completeRequest(char)::buffer_abi_cxx11_._M_string_length
                                ,text);
    this->method = MVar2;
    break;
  case URI:
    if (input != ' ') {
      if (((byte)input < 0x20) || (input == '\x7f')) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_00112658;
      }
      this_01 = &this->uri;
      goto LAB_0011241f;
    }
    this->state = versionH;
    break;
  case versionH:
    this->state = versionT1;
    if (input != 'H') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case versionT1:
    this->state = versionT2;
    if (input != 'T') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case versionT2:
    this->state = versionP;
    if (input != 'T') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case versionP:
    this->state = versionSlash;
    if (input != 'P') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case versionSlash:
    this->state = versionMajorStart;
    if (input != '/') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    this->httpVersionMajor = 0;
    this->httpVersionMinor = 0;
    break;
  case versionMajorStart:
    this->state = versionMajor;
    if ((byte)(input - 0x3aU) < 0xf6) {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    iVar4 = (uint)(byte)input + this->httpVersionMajor * 10 + -0x30;
LAB_00112441:
    this->httpVersionMajor = iVar4;
    break;
  case versionMajor:
    if (input != '.') {
      if (9 < (byte)(input - 0x30U)) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_00112658;
      }
      iVar4 = (uint)(byte)(input - 0x30U) + this->httpVersionMajor * 10;
      goto LAB_00112441;
    }
    this->state = versionMinorStart;
    break;
  case versionMinorStart:
    this->state = versionMinor;
    if ((byte)(input - 0x3aU) < 0xf6) {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    iVar4 = (uint)(byte)input + this->httpVersionMinor * 10 + -0x30;
LAB_00112378:
    this->httpVersionMinor = iVar4;
    break;
  case versionMinor:
    if (input != '\r') {
      if (9 < (byte)(input - 0x30U)) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_00112658;
      }
      iVar4 = (uint)(byte)(input - 0x30U) + this->httpVersionMinor * 10;
      goto LAB_00112378;
    }
    this->state = newline1;
    break;
  case newline1:
    this->state = headerLineStart;
    if (input != '\n') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case headerLineStart:
    if (input == '\r') {
      this->state = newline3;
    }
    else if (((this->super_Headers).headers.
              super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->super_Headers).headers.
              super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
              ._M_impl.super__Vector_impl_data._M_finish) || ((input != ' ' && (input != '\t')))) {
      if ((input < '\0') ||
         ((((byte)input < 0x20 || (input == '\x7f')) ||
          (bVar1 = completeRequest::anon_class_1_0_00000001::operator()(&local_69,input), bVar1))))
      {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_00112658;
      }
      local_68.value._M_dataplus._M_p = (pointer)&local_68.value.field_2;
      local_68.name.field_2._8_8_ = 0;
      local_68.value.field_2._8_8_ = 0;
      local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
      local_68.name._M_string_length = 0;
      local_68.name.field_2._M_allocated_capacity = 0;
      local_68.value._M_string_length = 0;
      local_68.value.field_2._M_allocated_capacity = 0;
      std::vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
      ::emplace_back<webfront::http::Headers::Header>
                ((vector<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                  *)this,&local_68);
      Headers::Header::~Header(&local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&(this->super_Headers).headers.
                  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].name,input);
      this->state = headerName;
    }
    else {
      this->state = headerLws;
    }
    break;
  case headerLws:
    if (input == '\t') {
      return false;
    }
    if (input == ' ') {
      return false;
    }
    if (input != '\r') {
      if (((byte)input < 0x20) || (input == '\x7f')) {
        this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
        BadRequestException::BadRequestException(this_00);
        goto LAB_00112658;
      }
      this->state = headerValue;
      this_01 = &(this->super_Headers).headers.
                 super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].value;
      goto LAB_0011241f;
    }
LAB_00112261:
    this->state = newline2;
    break;
  case headerName:
    if (input != ':') {
      if (((-1 < input) && (0x1f < (byte)input)) && (input != '\x7f')) {
        uVar3 = (int)input - 9;
        if (((0x37 < uVar3) || ((0xfe004982800001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
           ((uVar3 = (int)input - 0x5b, 0x22 < uVar3 ||
            ((0x500000007U >> ((ulong)uVar3 & 0x3f) & 1) == 0)))) {
          this_01 = &(this->super_Headers).headers.
                     super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].name;
          goto LAB_0011241f;
        }
      }
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    this->state = spaceBeforeHeaderValue;
    break;
  case spaceBeforeHeaderValue:
    this->state = headerValue;
    if (input != ' ') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case headerValue:
    if (input == '\r') goto LAB_00112261;
    if (((byte)input < 0x20) || (input == '\x7f')) {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    this_01 = &(this->super_Headers).headers.
               super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].value;
LAB_0011241f:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (this_01,input);
    break;
  case newline2:
    this->state = headerLineStart;
    if (input != '\n') {
      this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
      BadRequestException::BadRequestException(this_00);
      goto LAB_00112658;
    }
    break;
  case newline3:
    if (input == '\n') {
      this->state = completed;
      return true;
    }
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
    goto LAB_00112658;
  case completed:
    goto switchD_00111fbe_caseD_14;
  default:
    this_00 = (BadRequestException *)__cxa_allocate_exception(0x10);
    BadRequestException::BadRequestException(this_00);
LAB_00112658:
    __cxa_throw(this_00,&BadRequestException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = false;
switchD_00111fbe_caseD_14:
  return bVar1;
}

Assistant:

bool completeRequest(char input) {
        auto isChar = [](char c) { return c >= 0; };
        auto isCtrl = [](char c) { return (c >= 0 && c <= 31) || (c == 127); };
        auto isSpecial = [](char c) {   switch (c) {
            case '(': case ')': case '<': case '>': case '@': case ',': case ';': case ':': case '\\': case '"':
            case '/': case '[': case ']': case '?': case '=': case '{': case '}': case ' ': case '\t': return true;
            default: return false;
        }};
        auto isDigit = [](char c) { return c >= '0' && c <= '9'; };
        auto setState = [this](bool cond, State next) {
            state = next;
            if (cond) throw BadRequestException();
        };

        static std::string buffer;
        using enum State;
        switch (state) {
            case methodStart:
                setState(!isChar(input) || isCtrl(input) || isSpecial(input), method);
                buffer = input;
                break;
            case method: if (input == ' ') { state = URI; setMethod(buffer); }
                              else if (!isChar(input) || isCtrl(input) || isSpecial(input)) { throw BadRequestException(); }
                              else buffer.push_back(input);
                break;
            case URI: if (input == ' ') { state = versionH; break; }
                           else if (isCtrl(input)) throw BadRequestException();
                           else { uri.push_back(input); break; }
            case versionH: setState(input != 'H', versionT1); break;
            case versionT1: setState(input != 'T', versionT2); break;
            case versionT2: setState(input != 'T', versionP); break;
            case versionP: setState(input != 'P', versionSlash); break;
            case versionSlash: setState(input != '/', versionMajorStart); httpVersionMajor = 0; httpVersionMinor = 0; break;
            case versionMajorStart: setState(!isDigit(input), versionMajor); httpVersionMajor = httpVersionMajor * 10 + input - '0'; break;
            case versionMajor: if (input == '.') state = versionMinorStart;
                                    else if (isDigit(input)) httpVersionMajor = httpVersionMajor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case versionMinorStart: setState(!isDigit(input), versionMinor); httpVersionMinor = httpVersionMinor * 10 + input - '0'; break;
            case versionMinor: if (input == '\r') state = newline1;
                                    else if (isDigit(input)) httpVersionMinor = httpVersionMinor * 10 + input - '0';
                                    else throw BadRequestException();
                break;
            case newline1: setState(input != '\n', headerLineStart); break;
            case headerLineStart: if (input == '\r') { state = newline3; break; }
                                       else if (!headers.empty() && (input == ' ' || input == '\t')) { state = headerLws; break; }
                                       else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                       else { headers.push_back({}); headers.back().name.push_back(input); state = headerName; break; }
            case headerLws:if (input == '\r') { state = newline2; break; }
                                 else if (input == ' ' || input == '\t') break;
                                 else if (isCtrl(input)) throw BadRequestException();
                                 else { state = headerValue; headers.back().value.push_back(input); break; }
            case headerName: if (input == ':') { state = spaceBeforeHeaderValue; break; }
                                  else if (!isChar(input) || isCtrl(input) || isSpecial(input)) throw BadRequestException();
                                  else { headers.back().name.push_back(input); break; }
            case spaceBeforeHeaderValue: setState(input != ' ', headerValue); break;
            case headerValue: if (input == '\r') { state = newline2; break; }
                                   else if (isCtrl(input)) throw BadRequestException();
                                   else { headers.back().value.push_back(input); break; }
            case newline2: setState(input != '\n', headerLineStart); break;
            case newline3: if (input == '\n') { state = completed; return true; } else throw BadRequestException();
            case completed: return true;
            default: throw BadRequestException();
        }
        return false;
    }